

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O2

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::InternalSwap
          (RepeatedPtrFieldBase *this,RepeatedPtrFieldBase *rhs)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  LogMessage *other;
  undefined1 local_98 [24];
  _Alloc_hider local_80;
  tuple<google::protobuf::Arena_*,_int,_int,_google::protobuf::internal::RepeatedPtrFieldBase::Rep_*>
  local_60;
  tuple<google::protobuf::Arena_*,_int,_int,_google::protobuf::internal::RepeatedPtrFieldBase::Rep_*>
  local_48;
  
  if (this == rhs) {
    LogMessage::LogMessage
              ((LogMessage *)local_98,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
               ,0x6f7);
    other = LogMessage::operator<<((LogMessage *)local_98,"CHECK failed: this != rhs: ");
    LogFinisher::operator=((LogFinisher *)&local_60,other);
    LogMessage::~LogMessage((LogMessage *)local_98);
  }
  local_98._16_8_ = &rhs->current_size_;
  local_98._8_8_ = &rhs->total_size_;
  local_98._0_8_ = &rhs->rep_;
  local_60.
  super__Tuple_impl<0UL,_google::protobuf::Arena_*,_int,_int,_google::protobuf::internal::RepeatedPtrFieldBase::Rep_*>
  .super__Tuple_impl<1UL,_int,_int,_google::protobuf::internal::RepeatedPtrFieldBase::Rep_*>.
  super__Tuple_impl<2UL,_int,_google::protobuf::internal::RepeatedPtrFieldBase::Rep_*>.
  super__Tuple_impl<3UL,_google::protobuf::internal::RepeatedPtrFieldBase::Rep_*>.
  super__Head_base<3UL,_google::protobuf::internal::RepeatedPtrFieldBase::Rep_*,_false>._M_head_impl
       = (_Head_base<3UL,_google::protobuf::internal::RepeatedPtrFieldBase::Rep_*,_false>)rhs->rep_;
  uVar1 = rhs->current_size_;
  uVar3 = rhs->total_size_;
  local_60.
  super__Tuple_impl<0UL,_google::protobuf::Arena_*,_int,_int,_google::protobuf::internal::RepeatedPtrFieldBase::Rep_*>
  .super__Tuple_impl<1UL,_int,_int,_google::protobuf::internal::RepeatedPtrFieldBase::Rep_*>.
  super__Tuple_impl<2UL,_int,_google::protobuf::internal::RepeatedPtrFieldBase::Rep_*>._12_4_ =
       uVar1;
  local_60.
  super__Tuple_impl<0UL,_google::protobuf::Arena_*,_int,_int,_google::protobuf::internal::RepeatedPtrFieldBase::Rep_*>
  .super__Tuple_impl<1UL,_int,_int,_google::protobuf::internal::RepeatedPtrFieldBase::Rep_*>.
  super__Tuple_impl<2UL,_int,_google::protobuf::internal::RepeatedPtrFieldBase::Rep_*>.
  super__Head_base<2UL,_int,_false>._M_head_impl = uVar3;
  local_60.
  super__Tuple_impl<0UL,_google::protobuf::Arena_*,_int,_int,_google::protobuf::internal::RepeatedPtrFieldBase::Rep_*>
  .super__Head_base<0UL,_google::protobuf::Arena_*,_false>._M_head_impl = rhs->arena_;
  local_48.
  super__Tuple_impl<0UL,_google::protobuf::Arena_*,_int,_int,_google::protobuf::internal::RepeatedPtrFieldBase::Rep_*>
  .super__Tuple_impl<1UL,_int,_int,_google::protobuf::internal::RepeatedPtrFieldBase::Rep_*>.
  super__Tuple_impl<2UL,_int,_google::protobuf::internal::RepeatedPtrFieldBase::Rep_*>.
  super__Tuple_impl<3UL,_google::protobuf::internal::RepeatedPtrFieldBase::Rep_*>.
  super__Head_base<3UL,_google::protobuf::internal::RepeatedPtrFieldBase::Rep_*,_false>._M_head_impl
       = (_Head_base<3UL,_google::protobuf::internal::RepeatedPtrFieldBase::Rep_*,_false>)this->rep_
  ;
  uVar2 = this->current_size_;
  uVar4 = this->total_size_;
  local_48.
  super__Tuple_impl<0UL,_google::protobuf::Arena_*,_int,_int,_google::protobuf::internal::RepeatedPtrFieldBase::Rep_*>
  .super__Tuple_impl<1UL,_int,_int,_google::protobuf::internal::RepeatedPtrFieldBase::Rep_*>.
  super__Tuple_impl<2UL,_int,_google::protobuf::internal::RepeatedPtrFieldBase::Rep_*>._12_4_ =
       uVar2;
  local_48.
  super__Tuple_impl<0UL,_google::protobuf::Arena_*,_int,_int,_google::protobuf::internal::RepeatedPtrFieldBase::Rep_*>
  .super__Tuple_impl<1UL,_int,_int,_google::protobuf::internal::RepeatedPtrFieldBase::Rep_*>.
  super__Tuple_impl<2UL,_int,_google::protobuf::internal::RepeatedPtrFieldBase::Rep_*>.
  super__Head_base<2UL,_int,_false>._M_head_impl = uVar4;
  local_48.
  super__Tuple_impl<0UL,_google::protobuf::Arena_*,_int,_int,_google::protobuf::internal::RepeatedPtrFieldBase::Rep_*>
  .super__Head_base<0UL,_google::protobuf::Arena_*,_false>._M_head_impl = this->arena_;
  local_80._M_p = (pointer)rhs;
  std::
  tuple<google::protobuf::Arena*&,int&,int&,google::protobuf::internal::RepeatedPtrFieldBase::Rep*&>
  ::operator=((tuple<google::protobuf::Arena*&,int&,int&,google::protobuf::internal::RepeatedPtrFieldBase::Rep*&>
               *)local_98,&local_48);
  local_98._0_8_ = &this->rep_;
  local_98._8_8_ = &this->total_size_;
  local_98._16_8_ = &this->current_size_;
  local_80._M_p = (pointer)this;
  std::
  tuple<google::protobuf::Arena*&,int&,int&,google::protobuf::internal::RepeatedPtrFieldBase::Rep*&>
  ::operator=((tuple<google::protobuf::Arena*&,int&,int&,google::protobuf::internal::RepeatedPtrFieldBase::Rep*&>
               *)local_98,&local_60);
  return;
}

Assistant:

void RepeatedPtrFieldBase::InternalSwap(RepeatedPtrFieldBase* rhs) {
  GOOGLE_DCHECK(this != rhs);

  // Swap all fields at once.
  auto temp = std::make_tuple(rhs->arena_, rhs->current_size_, rhs->total_size_,
                              rhs->rep_);
  std::tie(rhs->arena_, rhs->current_size_, rhs->total_size_, rhs->rep_) =
      std::make_tuple(arena_, current_size_, total_size_, rep_);
  std::tie(arena_, current_size_, total_size_, rep_) = temp;
}